

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_read_string(sexp ctx,sexp in,int sentinel)

{
  long lVar1;
  undefined1 auVar2 [16];
  int len_00;
  ushort **ppuVar3;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  sexp res;
  char *tmp;
  char *buf;
  char initbuf [128];
  sexp_sint_t size;
  int i;
  int c;
  int len;
  uint local_114;
  uint local_110;
  int local_10c;
  undefined2 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefa;
  undefined1 in_stack_fffffffffffffefb;
  uint in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint local_e0;
  uint local_dc;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  sexp p;
  sexp in_stack_ffffffffffffff48;
  sexp local_b0;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = 0;
  local_28 = (sexp_conflict *)0x80;
  local_b0 = (sexp)&stack0xffffffffffffff58;
  p = (sexp)&DAT_0000003e;
  if (*(long *)(in_RSI + 0x28) == 0) {
    local_c8 = getc(*(FILE **)(in_RSI + 0x20));
  }
  else {
    if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
      lVar1 = *(long *)(in_RSI + 0x38);
      *(long *)(in_RSI + 0x38) = lVar1 + 1;
      local_c4 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
    }
    else {
      local_c4 = sexp_buffered_read_char(in_stack_ffffffffffffff48,(sexp)&DAT_0000003e);
    }
    local_c8 = local_c4;
  }
  local_1c = local_c8;
  do {
    if (local_1c == in_EDX) {
LAB_0011ce1e:
      if ((((ulong)p & 3) != 0) || (p->tag != 0x13)) {
        *(undefined1 *)((long)&local_b0->tag + (long)(int)local_20) = 0;
        p = sexp_c_string((sexp)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          CONCAT44(in_stack_fffffffffffffefc,
                                   CONCAT13(in_stack_fffffffffffffefb,
                                            CONCAT12(in_stack_fffffffffffffefa,
                                                     in_stack_fffffffffffffef8))));
      }
      if ((sexp_conflict *)local_28 != (sexp_conflict *)0x80) {
        free(local_b0);
      }
      return p;
    }
    if (local_1c == 0x5c) {
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_d0 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_cc = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_cc = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
        }
        local_d0 = local_cc;
      }
      local_1c = local_d0;
      switch(local_d0) {
      case 0x58:
      case 0x78:
        p = sexp_read_number((sexp)initbuf._8_8_,(sexp)initbuf._0_8_,buf._4_4_,(int)buf);
        if (((ulong)p & 1) != 1) break;
        if (*(long *)(in_RSI + 0x28) == 0) {
          local_e0 = getc(*(FILE **)(in_RSI + 0x20));
        }
        else {
          if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + 1;
            local_dc = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
          }
          else {
            local_dc = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
          }
          local_e0 = local_dc;
        }
        if ((local_e0 != 0x3b) && (local_e0 != 0xffffffff)) {
          if (*(long *)(in_RSI + 0x28) == 0) {
            ungetc(local_e0,*(FILE **)(in_RSI + 0x20));
          }
          else {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + -1;
            *(char *)(*(long *)(in_RSI + 0x28) + -1 + lVar1) = (char)local_e0;
          }
        }
        auVar2._8_8_ = (long)p >> 0x3f;
        auVar2._0_8_ = (ulong)p & 0xfffffffffffffffe;
        local_1c = SUB164(auVar2 / SEXT816(2),0);
        if ((uint)local_1c < 0x81) break;
        len_00 = sexp_utf8_char_byte_count(local_1c);
        sexp_utf8_encode_char((uchar *)((long)&local_b0->tag + (long)(int)local_20),len_00,local_1c)
        ;
        local_20 = len_00 + local_20;
        goto LAB_0011cce1;
      default:
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)local_d0] & 0x2000) == 0) break;
        while (local_1c == 0x20 || local_1c == 9) {
          if (*(long *)(in_RSI + 0x28) == 0) {
            in_stack_ffffffffffffff0c = getc(*(FILE **)(in_RSI + 0x20));
            local_1c = in_stack_ffffffffffffff0c;
          }
          else if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + 1;
            in_stack_ffffffffffffff0c = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
            local_1c = in_stack_ffffffffffffff0c;
          }
          else {
            in_stack_ffffffffffffff0c = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
            local_1c = in_stack_ffffffffffffff0c;
          }
        }
        if (local_1c == 0xd) {
          if (*(long *)(in_RSI + 0x28) == 0) {
            in_stack_ffffffffffffff04 = getc(*(FILE **)(in_RSI + 0x20));
            local_1c = in_stack_ffffffffffffff04;
          }
          else if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + 1;
            in_stack_ffffffffffffff04 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
            in_stack_ffffffffffffff08 = in_stack_ffffffffffffff04;
            local_1c = in_stack_ffffffffffffff04;
          }
          else {
            in_stack_ffffffffffffff04 = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
            in_stack_ffffffffffffff08 = in_stack_ffffffffffffff04;
            local_1c = in_stack_ffffffffffffff04;
          }
        }
        if (local_1c != 10) break;
        *(long *)(in_RSI + 0x40) = *(long *)(in_RSI + 0x40) + 1;
        do {
          if (*(long *)(in_RSI + 0x28) == 0) {
            in_stack_fffffffffffffefc = getc(*(FILE **)(in_RSI + 0x20));
          }
          else if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + 1;
            in_stack_fffffffffffffefc = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
            in_stack_ffffffffffffff00 = in_stack_fffffffffffffefc;
          }
          else {
            in_stack_fffffffffffffefc = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
            in_stack_ffffffffffffff00 = in_stack_fffffffffffffefc;
          }
          in_stack_fffffffffffffefb =
               in_stack_fffffffffffffefc == 0x20 || in_stack_fffffffffffffefc == 9;
        } while ((bool)in_stack_fffffffffffffefb);
        in_stack_fffffffffffffefa = 0;
        if (in_stack_fffffffffffffefc != 0xffffffff) {
          if (*(long *)(in_RSI + 0x28) == 0) {
            local_10c = ungetc(in_stack_fffffffffffffefc,*(FILE **)(in_RSI + 0x20));
          }
          else {
            lVar1 = *(long *)(in_RSI + 0x38);
            *(long *)(in_RSI + 0x38) = lVar1 + -1;
            *(char *)(*(long *)(in_RSI + 0x28) + -1 + lVar1) = (char)in_stack_fffffffffffffefc;
            local_10c = (int)(char)in_stack_fffffffffffffefc;
          }
          in_stack_fffffffffffffefa = local_10c != 0;
        }
        goto LAB_0011cd80;
      case 0x61:
        local_1c = 7;
        break;
      case 0x62:
        local_1c = 8;
        break;
      case 0x6e:
        local_1c = 10;
        break;
      case 0x72:
        local_1c = 0xd;
        break;
      case 0x74:
        local_1c = 9;
      }
      if ((((ulong)p & 3) == 0) && (p->tag == 0x13)) goto LAB_0011ce1e;
    }
    else if (local_1c == 10) {
      *(long *)(in_RSI + 0x40) = *(long *)(in_RSI + 0x40) + 1;
    }
    else if (local_1c == 0xffffffff) {
      p = sexp_read_error((sexp)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                          (sexp)in_stack_ffffffffffffff70,(sexp)in_stack_ffffffffffffff68);
      goto LAB_0011ce1e;
    }
    *(char *)((long)&local_b0->tag + (long)(int)local_20) = (char)local_1c;
    local_20 = local_20 + 1;
LAB_0011cce1:
    if ((long)local_28 <= (long)(local_20 + 4)) {
      in_stack_ffffffffffffff48 = (sexp)malloc(local_28 << 1);
      if (in_stack_ffffffffffffff48 == (sexp)0x0) {
        p = *(sexp *)(*(long *)(in_RDI + 0x28) + 0x38);
        goto LAB_0011ce1e;
      }
      memcpy(in_stack_ffffffffffffff48,local_b0,(long)(int)local_20);
      if ((sexp_conflict *)local_28 != (sexp_conflict *)0x80) {
        free(local_b0);
      }
      local_28 = local_28 << 1;
      local_b0 = in_stack_ffffffffffffff48;
    }
LAB_0011cd80:
    if (*(long *)(in_RSI + 0x28) == 0) {
      local_114 = getc(*(FILE **)(in_RSI + 0x20));
    }
    else {
      if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
        lVar1 = *(long *)(in_RSI + 0x38);
        *(long *)(in_RSI + 0x38) = lVar1 + 1;
        local_110 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
      }
      else {
        local_110 = sexp_buffered_read_char(in_stack_ffffffffffffff48,p);
      }
      local_114 = local_110;
    }
    local_1c = local_114;
  } while( true );
}

Assistant:

sexp sexp_read_string (sexp ctx, sexp in, int sentinel) {
#if SEXP_USE_UTF8_STRINGS
  int len;
#endif
  int c, i=0;
  sexp_sint_t size=INIT_STRING_BUFFER_SIZE;
  char initbuf[INIT_STRING_BUFFER_SIZE];
  char *buf=initbuf, *tmp;
  sexp res = SEXP_FALSE;

  for (c = sexp_read_char(ctx, in); c != sentinel; c = sexp_read_char(ctx, in)) {
    if (c == '\\') {
      c = sexp_read_char(ctx, in);
      switch (c) {
      case 'a': c = '\a'; break;
      case 'b': c = '\b'; break;
      case 'n': c = '\n'; break;
      case 'r': c = '\r'; break;
      case 't': c = '\t'; break;
      case 'x': case 'X':
        res = sexp_read_number(ctx, in, 16, 0);
        if (sexp_fixnump(res)) {
          c = sexp_read_char(ctx, in);
          if (c != ';') {
#if SEXP_USE_ESCAPE_REQUIRES_TRAILING_SEMI_COLON
            res = sexp_read_error(ctx, "missing ; in \\x escape", SEXP_NULL, in);
#else
            sexp_push_char(ctx, c, in);
#endif
          }
          c = sexp_unbox_fixnum(res);
#if SEXP_USE_UTF8_STRINGS
          if ((unsigned)c > 0x80) {
            len = sexp_utf8_char_byte_count(c);
            sexp_utf8_encode_char((unsigned char*)buf + i, len, c);
            i += len;
            goto maybe_expand;
          }
#endif
        }
        break;
#if SEXP_USE_ESCAPE_NEWLINE
      default:
        if (isspace(c)) {
          while (c==' ' || c=='\t') c=sexp_read_char(ctx, in);
          if (c=='\r') c=sexp_read_char(ctx, in);
          if (c=='\n') {
            sexp_port_line(in)++;
            do {c=sexp_read_char(ctx, in);} while (c==' ' || c=='\t');
            sexp_push_char(ctx, c, in);
            continue;
          }
        }
#endif
      }
      if (sexp_exceptionp(res)) break;
    } else if (c == '\n') {
      sexp_port_line(in)++;
    } else if (c == EOF) {
      res = sexp_read_error(ctx, "premature end of string", SEXP_NULL, in);
      break;
    }
    buf[i++] = c;
  maybe_expand:
    if (i+4 >= size) {       /* expand buffer w/ malloc(), later free() it */
      tmp = (char*) sexp_malloc(size*2);
      if (!tmp) {res = sexp_global(ctx, SEXP_G_OOM_ERROR); break;}
      memcpy(tmp, buf, i);
      if (size != INIT_STRING_BUFFER_SIZE) free(buf);
      buf = tmp;
      size *= 2;
    }
  }

  if (!sexp_exceptionp(res)) {
    buf[i] = '\0';
    res = sexp_c_string(ctx, buf, i);
  }
  if (size != INIT_STRING_BUFFER_SIZE) free(buf);
  return res;
}